

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O3

void __thiscall QHostInfo::QHostInfo(QHostInfo *this,int id)

{
  QHostInfoPrivate *pQVar1;
  QHostInfoPrivate *d;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  Data *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QHostInfoPrivate *)operator_new(0x58);
  pQVar1->err = NoError;
  QVar2.m_data = (storage_type *)0xd;
  QVar2.m_size = (qsizetype)&local_48;
  QString::fromLatin1(QVar2);
  (pQVar1->errorStr).d.d = local_48;
  (pQVar1->errorStr).d.ptr = pcStack_40;
  (pQVar1->errorStr).d.size = local_38;
  (pQVar1->hostName).d.ptr = (char16_t *)0x0;
  (pQVar1->hostName).d.size = 0;
  (pQVar1->addrs).d.size = 0;
  (pQVar1->hostName).d.d = (Data *)0x0;
  (pQVar1->addrs).d.d = (Data *)0x0;
  (pQVar1->addrs).d.ptr = (QHostAddress *)0x0;
  this->d_ptr = pQVar1;
  pQVar1->lookupId = id;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHostInfo::QHostInfo(int id)
    : d_ptr(new QHostInfoPrivate)
{
    Q_D(QHostInfo);
    d->lookupId = id;
}